

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenuPrivate::setPlatformMenu(QMenuPrivate *this,QPlatformMenu *menu)

{
  QPointer<QPlatformMenu> *this_00;
  char *pcVar1;
  Data *pDVar2;
  bool bVar3;
  QObject *pQVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  QObject local_40 [8];
  QObject local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = &this->platformMenu;
  bVar3 = QWeakPointer<QObject>::isNull(&this_00->wp);
  if ((!bVar3) && (pDVar2 = (this_00->wp).d, pDVar2 != (Data *)0x0)) {
    pQVar4 = (this->platformMenu).wp.value;
    if ((*(long *)(*(long *)(pQVar4 + 8) + 0x10) == 0) && (*(int *)(pDVar2 + 4) != 0)) {
      (**(code **)(*(long *)pQVar4 + 0x20))();
    }
  }
  QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)menu);
  bVar3 = QWeakPointer<QObject>::isNull(&this_00->wp);
  if (!bVar3) {
    pDVar2 = (this_00->wp).d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this->platformMenu).wp.value;
    }
    pQVar5 = (QObject *)0x0;
    QObject::connect(local_38,(char *)pQVar4,(QObject *)"2aboutToShow()",pcVar1,0x6609aa);
    QMetaObject::Connection::~Connection((Connection *)local_38);
    pDVar2 = (this_00->wp).d;
    if (pDVar2 != (Data *)0x0) {
      if (*(int *)(pDVar2 + 4) == 0) {
        pQVar5 = (QObject *)0x0;
      }
      else {
        pQVar5 = (this->platformMenu).wp.value;
      }
    }
    QObject::connect(local_40,(char *)pQVar5,(QObject *)"2aboutToHide()",pcVar1,0x6609c8);
    QMetaObject::Connection::~Connection((Connection *)local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::setPlatformMenu(QPlatformMenu *menu)
{
    Q_Q(QMenu);
    if (!platformMenu.isNull() && !platformMenu->parent())
        delete platformMenu.data();

    platformMenu = menu;
    if (!platformMenu.isNull()) {
        QObject::connect(platformMenu, SIGNAL(aboutToShow()), q, SLOT(_q_platformMenuAboutToShow()));
        QObject::connect(platformMenu, SIGNAL(aboutToHide()), q, SIGNAL(aboutToHide()));
    }
}